

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DriverProxy.h
# Opt level: O0

int64_t __thiscall aeron::DriverProxy::clientClose(DriverProxy *this)

{
  int64_t iVar1;
  int64_t correlationId;
  anon_class_16_2_3aef6e2a *in_stack_000002c8;
  DriverProxy *in_stack_000002d0;
  
  iVar1 = concurrent::ringbuffer::ManyToOneRingBuffer::nextCorrelationId
                    ((ManyToOneRingBuffer *)0x1fcaea);
  writeCommandToDriver<aeron::DriverProxy::clientClose()::_lambda(aeron::concurrent::AtomicBuffer&,int&)_1_>
            (in_stack_000002d0,in_stack_000002c8);
  return iVar1;
}

Assistant:

std::int64_t clientClose()
    {
        std::int64_t correlationId = m_toDriverCommandBuffer.nextCorrelationId();

        writeCommandToDriver([&](AtomicBuffer& buffer, util::index_t& length)
        {
            CorrelatedMessageFlyweight correlatedMessage(buffer, 0);

            correlatedMessage.clientId(m_clientId);
            correlatedMessage.correlationId(correlationId);

            length = CORRELATED_MESSAGE_LENGTH;

            return ControlProtocolEvents::CLIENT_CLOSE;
        });

        return correlationId;
    }